

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.cc
# Opt level: O1

int google::protobuf::io::CodedOutputStream::VarintSize32Fallback(uint32 value)

{
  int iVar1;
  
  iVar1 = 1;
  if (((0x7f < value) && (iVar1 = 2, 0x3fff < value)) && (iVar1 = 3, 0x1fffff < value)) {
    iVar1 = 5 - (uint)(value < 0x10000000);
  }
  return iVar1;
}

Assistant:

int CodedOutputStream::VarintSize32Fallback(uint32 value) {
  if (value < (1 << 7)) {
    return 1;
  } else if (value < (1 << 14)) {
    return 2;
  } else if (value < (1 << 21)) {
    return 3;
  } else if (value < (1 << 28)) {
    return 4;
  } else {
    return 5;
  }
}